

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O0

bool __thiscall
helics::MessageTimer::updateTimer(MessageTimer *this,int32_t timerIndex,time_type expirationTime)

{
  action_t aVar1;
  size_type sVar2;
  reference pvVar3;
  reference this_00;
  rep in_RDX;
  int in_ESI;
  basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
  *in_RDI;
  bool ret;
  type timerCallback;
  lock_guard<std::mutex> lock;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar4;
  time_point *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool local_1;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,
             (mutex_type *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (-1 < in_ESI) {
    iVar4 = in_ESI;
    sVar2 = std::
            vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
            ::size((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                    *)&in_RDI[1].impl_.implementation_.might_have_pending_waits);
    if (iVar4 < (int)sVar2) {
      std::
      vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
      ::operator[]((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                    *)&in_RDI[1].impl_.implementation_.might_have_pending_waits,(long)in_ESI);
      std::
      __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x6a9a2b);
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::expires_at((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                    *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8);
      std::enable_shared_from_this<helics::MessageTimer>::shared_from_this
                ((enable_shared_from_this<helics::MessageTimer> *)
                 CONCAT44(iVar4,in_stack_ffffffffffffff98));
      pvVar3 = std::
               vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
               ::operator[]((vector<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
                             *)((in_RDI->impl_).executor_.
                                super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                                .super_any_executor_base.object_.data + 0x10),(long)in_ESI);
      (pvVar3->__d).__r = in_RDX;
      this_00 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
                operator[]((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                           &(in_RDI->impl_).implementation_.timer_data.prev_,(long)in_ESI);
      aVar1 = ActionMessage::action(this_00);
      local_1 = aVar1 != cmd_ignore;
      std::
      vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
      ::operator[]((vector<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                    *)&in_RDI[1].impl_.implementation_.might_have_pending_waits,(long)in_ESI);
      std::
      __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x6a9aae);
      asio::
      basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
      ::
      async_wait<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30)_&>
                (in_RDI,(type *)CONCAT44(iVar4,in_stack_ffffffffffffff98));
      updateTimer(int,std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>)
      ::$_0::~__0((type *)0x6a9ad9);
      goto LAB_006a9b12;
    }
  }
  local_1 = false;
LAB_006a9b12:
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x6a9b1c);
  return local_1;
}

Assistant:

bool MessageTimer::updateTimer(int32_t timerIndex, time_type expirationTime)
{
    std::lock_guard<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        timers[timerIndex]->expires_at(expirationTime);
        auto timerCallback = [ptr = shared_from_this(), timerIndex](const std::error_code& ec) {
            processTimerCallback(ptr, timerIndex, ec);
        };
        expirationTimes[timerIndex] = expirationTime;
        auto ret = (buffers[timerIndex].action() != CMD_IGNORE);
        timers[timerIndex]->async_wait(timerCallback);
        return ret;
    }
    return false;
}